

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::type_to_array_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t variable_id)

{
  bool bVar1;
  undefined4 in_EAX;
  uint32_t uVar2;
  SPIRVariable *var;
  SPIRType *type_00;
  char (*in_R8) [2];
  undefined4 uStack_28;
  uint32_t local_24;
  
  if ((ControlPointArray < type->basetype) ||
     ((0x300800U >> (type->basetype & (Image|Struct)) & 1) == 0)) {
    uStack_28 = in_EAX;
    bVar1 = Compiler::type_is_array_of_pointers((Compiler *)this,type);
    if ((!bVar1) &&
       (((this->msl_options).force_native_arrays == false &&
        ((this->is_using_builtin_array & 1U) == 0)))) {
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"",(allocator *)((long)&uStack_28 + 3));
      return __return_storage_ptr__;
    }
    if (variable_id != 0) {
      var = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,variable_id);
      if ((var->storage == StorageBuffer) || (var->storage == StorageClassUniform)) {
        type_00 = Compiler::get_variable_data_type((Compiler *)this,var);
        bVar1 = Compiler::is_array((Compiler *)this,type_00);
        if (bVar1) {
          uVar2 = get_resource_array_size(this,type,variable_id);
          _uStack_28 = CONCAT44(uVar2,uStack_28);
          join<char_const(&)[2],unsigned_int,char_const(&)[2]>
                    (__return_storage_ptr__,(spirv_cross *)0x349808,(char (*) [2])&local_24,
                     (uint *)0x38a005,in_R8);
          return __return_storage_ptr__;
        }
      }
    }
  }
  CompilerGLSL::type_to_array_glsl_abi_cxx11_
            (__return_storage_ptr__,&this->super_CompilerGLSL,type,variable_id);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::type_to_array_glsl(const SPIRType &type, uint32_t variable_id)
{
	// Allow Metal to use the array<T> template to make arrays a value type
	switch (type.basetype)
	{
	case SPIRType::AtomicCounter:
	case SPIRType::ControlPointArray:
	case SPIRType::RayQuery:
		return CompilerGLSL::type_to_array_glsl(type, variable_id);

	default:
		if (type_is_array_of_pointers(type) || using_builtin_array())
		{
			const SPIRVariable *var = variable_id ? &get<SPIRVariable>(variable_id) : nullptr;
			if (var && (var->storage == StorageClassUniform || var->storage == StorageClassStorageBuffer) &&
			    is_array(get_variable_data_type(*var)))
			{
				return join("[", get_resource_array_size(type, variable_id), "]");
			}
			else
				return CompilerGLSL::type_to_array_glsl(type, variable_id);
		}
		else
			return "";
	}
}